

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

void __thiscall
PlanningUnitMADPDiscrete::DeInitializeJointActionObservationHistories
          (PlanningUnitMADPDiscrete *this)

{
  bool bVar1;
  mapped_type *ppJVar2;
  reference ppJVar3;
  __normal_iterator<const_JointBeliefInterface_**,_std::vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>_>
  *in_RDI;
  map<unsigned_long_long,_JointActionObservationHistoryTree_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>_>_>
  *unaff_retaddr;
  iterator last;
  iterator it;
  JointBeliefInterface *in_stack_ffffffffffffffb8;
  mapped_type in_stack_ffffffffffffffc0;
  __normal_iterator<const_JointBeliefInterface_**,_std::vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>_>
  local_18;
  undefined8 local_10;
  __normal_iterator<const_JointBeliefInterface_**,_std::vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>_>
  *__k;
  
  __k = in_RDI;
  if (in_RDI[0x53]._M_current != (JointBeliefInterface **)0x0) {
    (*(code *)(*in_RDI[0x53]._M_current)[1])();
  }
  std::
  vector<JointActionObservationHistoryTree_*,_std::allocator<JointActionObservationHistoryTree_*>_>
  ::clear((vector<JointActionObservationHistoryTree_*,_std::allocator<JointActionObservationHistoryTree_*>_>
           *)0x9d3981);
  bVar1 = std::
          map<unsigned_long_long,_JointActionObservationHistoryTree_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>_>_>
          ::empty((map<unsigned_long_long,_JointActionObservationHistoryTree_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>_>_>
                   *)0x9d3992);
  if (!bVar1) {
    local_10 = 0;
    ppJVar2 = std::
              map<unsigned_long_long,_JointActionObservationHistoryTree_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>_>_>
              ::operator[](unaff_retaddr,(key_type *)__k);
    in_stack_ffffffffffffffc0 = *ppJVar2;
    if (in_stack_ffffffffffffffc0 != (mapped_type)0x0) {
      (*(in_stack_ffffffffffffffc0->super_TreeNode<JointActionObservationHistory>)._vptr_TreeNode[1]
      )();
    }
  }
  std::
  map<unsigned_long_long,_JointActionObservationHistoryTree_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>_>_>
  ::clear((map<unsigned_long_long,_JointActionObservationHistoryTree_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>_>_>
           *)0x9d39e1);
  bVar1 = PlanningUnitMADPDiscreteParameters::GetComputeJointBeliefs
                    ((PlanningUnitMADPDiscreteParameters *)((long)&in_RDI[7]._M_current + 1));
  if (bVar1) {
    local_18._M_current =
         (JointBeliefInterface **)
         std::vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>::
         begin((vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>
                *)in_stack_ffffffffffffffb8);
    std::vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>::end
              ((vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>
                *)in_stack_ffffffffffffffb8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_JointBeliefInterface_**,_std::vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>_>
                               *)in_stack_ffffffffffffffc0,
                              (__normal_iterator<const_JointBeliefInterface_**,_std::vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>_>
                               *)in_stack_ffffffffffffffb8), bVar1) {
      ppJVar3 = __gnu_cxx::
                __normal_iterator<const_JointBeliefInterface_**,_std::vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>_>
                ::operator*(&local_18);
      in_stack_ffffffffffffffb8 = *ppJVar3;
      if (in_stack_ffffffffffffffb8 != (JointBeliefInterface *)0x0) {
        (**(code **)((long)*in_stack_ffffffffffffffb8 + 8))();
      }
      __gnu_cxx::
      __normal_iterator<const_JointBeliefInterface_**,_std::vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>_>
      ::operator++(in_RDI,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    }
    std::vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>::clear
              ((vector<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>
                *)0x9d3a7e);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x9d3a8f);
  }
  in_RDI[0x2c]._M_current = (JointBeliefInterface **)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9d3aab);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::clear
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x9d3abc);
  return;
}

Assistant:

void PlanningUnitMADPDiscrete::DeInitializeJointActionObservationHistories()
{
    delete _m_jointActionObservationHistoryTreeRoot;//should recursively delete

    _m_jointActionObservationHistoryTreeVector.clear();

    // clear the map
    if(!_m_jointActionObservationHistoryTreeMap.empty())
        delete _m_jointActionObservationHistoryTreeMap[0];
    _m_jointActionObservationHistoryTreeMap.clear();
       
    if(_m_params.GetComputeJointBeliefs())
    {
        vector<const JointBeliefInterface*>::iterator it =
            _m_jBeliefCache.begin();
        vector<const JointBeliefInterface*>::iterator last =
            _m_jBeliefCache.end();
        
        while(it != last)
        {
            delete(*it);
            it++;
        }
        _m_jBeliefCache.clear();
        _m_jaohConditionalProbs.clear();
    }

    _m_nrJointActionObservationHistories=0;
    _m_nrJointActionObservationHistoriesT.clear();
    _m_firstJAOHIforT.clear();
}